

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Base.cpp
# Opt level: O2

void __thiscall
chrono::ChFunction::Estimate_y_range
          (ChFunction *this,double xmin,double xmax,double *ymin,double *ymax,int derivate)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [64];
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  dVar6 = xmax - xmin;
  *ymin = 10000.0;
  *ymax = -10000.0;
  auVar5 = ZEXT1664(ZEXT816(0xc0c3880000000000));
  while( true ) {
    auVar3 = auVar5._0_16_;
    if (xmax <= xmin) break;
    dVar2 = xmin;
    (*this->_vptr_ChFunction[10])(this,(ulong)(uint)derivate);
    if (dVar2 < *ymin) {
      dVar2 = xmin;
      (*this->_vptr_ChFunction[10])(this,(ulong)(uint)derivate);
      *ymin = dVar2;
    }
    dVar2 = xmin;
    (*this->_vptr_ChFunction[10])(this,(ulong)(uint)derivate);
    auVar5 = ZEXT864((ulong)*ymax);
    if (*ymax < dVar2) {
      auVar5 = ZEXT864((ulong)xmin);
      (*this->_vptr_ChFunction[10])(this,(ulong)(uint)derivate);
      *ymax = auVar5._0_8_;
    }
    xmin = xmin + dVar6 / 100.0;
  }
  dVar6 = *ymin;
  auVar1._8_8_ = 0x7fffffffffffffff;
  auVar1._0_8_ = 0x7fffffffffffffff;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = auVar5._0_8_ - dVar6;
  auVar1 = vandpd_avx512vl(auVar9,auVar1);
  if (auVar1._0_8_ < 1e-11) {
    auVar3 = ZEXT816(0x3ff0000000000000);
    *ymin = -0.5;
    *ymax = 1.0;
    dVar6 = *ymin;
  }
  auVar7._8_8_ = 0;
  auVar7._0_8_ = auVar3._0_8_ - dVar6;
  auVar3 = vfmadd132sd_fma(auVar7,auVar3,ZEXT816(0x3fbeb851eb851eb8));
  *ymax = auVar3._0_8_;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *ymin;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = auVar3._0_8_ - *ymin;
  auVar3 = vfmadd132sd_fma(auVar8,auVar4,ZEXT816(0xbfbeb851eb851eb8));
  *ymin = auVar3._0_8_;
  return;
}

Assistant:

void ChFunction::Estimate_y_range(double xmin, double xmax, double& ymin, double& ymax, int derivate) const {
    ymin = 10000;
    ymax = -10000;
    for (double mx = xmin; mx < xmax; mx += (xmax - xmin) / 100.0) {
        if (Get_y_dN(mx, derivate) < ymin)
            ymin = Get_y_dN(mx, derivate);
        if (Get_y_dN(mx, derivate) > ymax)
            ymax = Get_y_dN(mx, derivate);
    }
    if (fabs(ymax - ymin) < 10e-12) {
        ymin = -0.5;
        ymax = +1.0;
    }
    ymax += 0.12 * (ymax - ymin);
    ymin -= 0.12 * (ymax - ymin);
}